

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack23_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *in;
  *out = uVar1 & 0x7fffff;
  out[1] = uVar1 >> 0x17;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x17 | (uVar2 & 0x3fff) << 9;
  uVar1 = in[2];
  out[2] = uVar2 >> 0xe;
  out[2] = uVar2 >> 0xe | (uVar1 & 0x1f) << 0x12;
  uVar2 = in[3];
  out[3] = uVar1 >> 5 & 0x7fffff;
  out[4] = uVar1 >> 0x1c;
  out[4] = uVar1 >> 0x1c | (uVar2 & 0x7ffff) << 4;
  uVar1 = in[4];
  out[5] = uVar2 >> 0x13;
  out[5] = uVar2 >> 0x13 | (uVar1 & 0x3ff) << 0xd;
  out[6] = uVar1 >> 10;
  uVar2 = in[5];
  out[6] = uVar1 >> 10 | (uVar2 & 1) << 0x16;
  out[7] = uVar2 >> 1 & 0x7fffff;
  out[8] = uVar2 >> 0x18;
  uVar1 = in[6];
  out[8] = uVar2 >> 0x18 | (uVar1 & 0x7fff) << 8;
  out[9] = uVar1 >> 0xf;
  uVar2 = in[7];
  out[9] = uVar1 >> 0xf | (uVar2 & 0x3f) << 0x11;
  out[10] = uVar2 >> 6 & 0x7fffff;
  out[0xb] = uVar2 >> 0x1d;
  uVar1 = in[8];
  uVar3 = in[9];
  out[0xb] = uVar2 >> 0x1d | (uVar1 & 0xfffff) << 3;
  out[0xc] = uVar1 >> 0x14;
  out[0xc] = uVar1 >> 0x14 | (uVar3 & 0x7ff) << 0xc;
  uVar1 = in[10];
  out[0xd] = uVar3 >> 0xb;
  out[0xd] = uVar3 >> 0xb | (uVar1 & 3) << 0x15;
  out[0xe] = uVar1 >> 2 & 0x7fffff;
  uVar2 = in[0xb];
  out[0xf] = uVar1 >> 0x19;
  out[0xf] = (uVar2 & 0xffff) << 7 | uVar1 >> 0x19;
  return in + 0xc;
}

Assistant:

const uint32_t *__fastunpack23_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 14)) << (23 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 5)) << (23 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 23);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 19)) << (23 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 10)) << (23 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 1)) << (23 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 23);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 15)) << (23 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 6)) << (23 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 23);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 20)) << (23 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 11)) << (23 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 2)) << (23 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 23);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 16)) << (23 - 16);
  out++;

  return in + 1;
}